

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime_interface.cpp
# Opt level: O2

XrGeneratedDispatchTableCore *
RuntimeInterface::GetDebugUtilsMessengerDispatchTable(XrDebugUtilsMessengerEXT messenger)

{
  unique_ptr<RuntimeInterface,_std::default_delete<RuntimeInterface>_> *puVar1;
  XrGeneratedDispatchTableCore *pXVar2;
  mutex *__mutex;
  key_type local_18;
  
  puVar1 = GetInstance();
  __mutex = &((puVar1->_M_t).
              super___uniq_ptr_impl<RuntimeInterface,_std::default_delete<RuntimeInterface>_>._M_t.
              super__Tuple_impl<0UL,_RuntimeInterface_*,_std::default_delete<RuntimeInterface>_>.
              super__Head_base<0UL,_RuntimeInterface_*,_false>._M_head_impl)->
             _messenger_to_instance_mutex;
  std::mutex::lock(__mutex);
  puVar1 = GetInstance();
  std::
  _Hashtable<XrDebugUtilsMessengerEXT_T_*,_std::pair<XrDebugUtilsMessengerEXT_T_*const,_XrInstance_T_*>,_std::allocator<std::pair<XrDebugUtilsMessengerEXT_T_*const,_XrInstance_T_*>_>,_std::__detail::_Select1st,_std::equal_to<XrDebugUtilsMessengerEXT_T_*>,_std::hash<XrDebugUtilsMessengerEXT_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::find(&(((puVar1->_M_t).
            super___uniq_ptr_impl<RuntimeInterface,_std::default_delete<RuntimeInterface>_>._M_t.
            super__Tuple_impl<0UL,_RuntimeInterface_*,_std::default_delete<RuntimeInterface>_>.
            super__Head_base<0UL,_RuntimeInterface_*,_false>._M_head_impl)->
          _messenger_to_instance_map)._M_h,&local_18);
  GetInstance();
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  pXVar2 = GetDispatchTable((XrInstance)0x11609b);
  return pXVar2;
}

Assistant:

const XrGeneratedDispatchTableCore* RuntimeInterface::GetDebugUtilsMessengerDispatchTable(XrDebugUtilsMessengerEXT messenger) {
    XrInstance runtime_instance = XR_NULL_HANDLE;
    {
        std::lock_guard<std::mutex> mlock(GetInstance()->_messenger_to_instance_mutex);
        auto it = GetInstance()->_messenger_to_instance_map.find(messenger);
        if (it != GetInstance()->_messenger_to_instance_map.end()) {
            runtime_instance = it->second;
        }
    }
    return GetDispatchTable(runtime_instance);
}